

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  undefined1 *a;
  uint *puVar1;
  int32_t iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low;
  Breakpoint *pBVar5;
  pointer pnVar6;
  pointer pBVar7;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  type_conflict5 tVar20;
  int iVar21;
  DataKey DVar22;
  undefined8 uVar23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  long lVar28;
  uint uVar29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  uint uVar30;
  multiprecision *this_00;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar31;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  cpp_dec_float<100U,_int,_void> *pcVar36;
  fpclass_type fVar37;
  bool bVar38;
  bool bVar39;
  ulong uVar40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd_01;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_01;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low_01;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar41;
  int nBp;
  uint local_b38;
  fpclass_type local_b34;
  cpp_dec_float<100U,_int,_void> *local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b28;
  int local_b1c;
  int local_b18;
  int minIdx;
  int *local_b10;
  SPxId enterId;
  uint local_afc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9c8;
  cpp_dec_float<100U,_int,_void> local_978;
  cpp_dec_float<100U,_int,_void> *local_928;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_920;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupd;
  BreakpointCompare local_838;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_830;
  long local_828;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_820;
  cpp_dec_float<100U,_int,_void> local_818;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_778;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_728;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_688;
  multiprecision local_638 [8];
  uint auStack_630 [2];
  uint local_628 [2];
  uint auStack_620 [2];
  uint local_618 [2];
  uint auStack_610 [2];
  uint local_608 [2];
  undefined8 uStack_600;
  int local_5f8;
  undefined1 local_5f4;
  fpclass_type local_5f0;
  int32_t local_5ec;
  multiprecision local_5e8 [8];
  uint auStack_5e0 [2];
  uint local_5d8 [2];
  uint auStack_5d0 [2];
  uint local_5c8 [2];
  uint auStack_5c0 [2];
  uint local_5b8 [2];
  undefined8 uStack_5b0;
  int local_5a8;
  undefined1 local_5a4;
  fpclass_type local_5a0;
  int32_t local_59c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_598;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  multiprecision local_4f8 [8];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  uint auStack_4d0 [2];
  uint local_4c8 [2];
  undefined8 uStack_4c0;
  int local_4b8;
  undefined1 local_4b4;
  fpclass_type local_4b0;
  int32_t iStack_4ac;
  multiprecision local_4a8 [8];
  uint auStack_4a0 [2];
  uint local_498 [2];
  uint auStack_490 [2];
  uint local_488 [2];
  uint auStack_480 [2];
  uint local_478 [2];
  undefined8 uStack_470;
  int local_468;
  undefined1 local_464;
  fpclass_type local_460;
  int32_t iStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  int local_418;
  undefined1 local_414;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  int local_3c8;
  undefined1 local_3c4;
  undefined8 local_3c0;
  Breakpoint tmp;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  int local_318;
  undefined1 local_314;
  undefined8 local_310;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->leaveCount % 100 == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x174,1);
  }
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x171 == '\x01' && !polish) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep != ROW)) {
    a = &(this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).field_0x174;
    tmp.val.m_backend.data._M_elems._0_8_ =
         tmp.val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar20 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)a,(int *)&tmp);
    if (!tVar20) {
      pSVar3 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      pUVar31 = pSVar3->theCoPvec;
      pUVar4 = pSVar3->thePvec;
      vec_01 = (pUVar4->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      upd_01 = (pUVar4->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b10 = (pUVar4->thedelta).super_IdxSet.idx;
      local_b34 = (pUVar4->thedelta).super_IdxSet.num;
      low_01 = (pSVar3->theLbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar27 = (pSVar3->theUbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      vec = (pUVar31->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      upd = (pUVar31->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_b28 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(pUVar31->thedelta).super_IdxSet.idx;
      local_b30 = (cpp_dec_float<100U,_int,_void> *)
                  CONCAT44(local_b30._4_4_,(pUVar31->thedelta).super_IdxSet.num);
      low = (pSVar3->theCoLbound->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      upp_00 = (pSVar3->theCoUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tmp.val.m_backend.fpclass = cpp_dec_float_finite;
      tmp.val.m_backend.prec_elem = 0x10;
      tmp.val.m_backend.data._M_elems[0] = 0;
      tmp.val.m_backend.data._M_elems[1] = 0;
      tmp.val.m_backend.data._M_elems[2] = 0;
      tmp.val.m_backend.data._M_elems[3] = 0;
      tmp.val.m_backend.data._M_elems[0xc] = 0;
      tmp.val.m_backend.data._M_elems[0xd] = 0;
      tmp.val.m_backend.data._M_elems._56_5_ = 0;
      tmp.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
      tmp.val.m_backend.exp = 0;
      tmp.val.m_backend.neg = false;
      tmp.val.m_backend.data._M_elems[4] = 0;
      tmp.val.m_backend.data._M_elems[5] = 0;
      tmp.val.m_backend.data._M_elems[6] = 0;
      tmp.val.m_backend.data._M_elems[7] = 0;
      tmp.val.m_backend.data._M_elems[8] = 0;
      tmp.val.m_backend.data._M_elems[9] = 0;
      tmp.val.m_backend.data._M_elems[10] = 0;
      tmp.val.m_backend.data._M_elems[0xb] = 0;
      local_978.fpclass = cpp_dec_float_finite;
      local_978.prec_elem = 0x10;
      local_978.data._M_elems[0] = 0;
      local_978.data._M_elems[1] = 0;
      local_978.data._M_elems[2] = 0;
      local_978.data._M_elems[3] = 0;
      local_978.data._M_elems[4] = 0;
      local_978.data._M_elems[5] = 0;
      local_978.data._M_elems[6] = 0;
      local_978.data._M_elems[7] = 0;
      local_978.data._M_elems[8] = 0;
      local_978.data._M_elems[9] = 0;
      local_978.data._M_elems[10] = 0;
      local_978.data._M_elems[0xb] = 0;
      local_978.data._M_elems[0xc] = 0;
      local_978.data._M_elems[0xd] = 0;
      local_978.data._M_elems._56_5_ = 0;
      local_978.data._M_elems[0xf]._1_3_ = 0;
      local_978.exp = 0;
      local_978.neg = false;
      enterId.super_DataKey.info = 0;
      enterId.super_DataKey.idx = -1;
      local_818.fpclass = cpp_dec_float_finite;
      local_818.prec_elem = 0x10;
      local_818.data._M_elems[0] = 0;
      local_818.data._M_elems[1] = 0;
      local_818.data._M_elems[2] = 0;
      local_818.data._M_elems[3] = 0;
      local_818.data._M_elems[4] = 0;
      local_818.data._M_elems[5] = 0;
      local_818.data._M_elems[6] = 0;
      local_818.data._M_elems[7] = 0;
      local_818.data._M_elems[0xc] = 0;
      local_818.data._M_elems[0xd] = 0;
      local_818.data._M_elems._56_5_ = 0;
      local_818.data._M_elems[0xf]._1_3_ = 0;
      local_818.exp = 0;
      local_818.neg = false;
      local_818.data._M_elems[8] = 0;
      local_818.data._M_elems[9] = 0;
      local_818.data._M_elems[10] = 0;
      local_818.data._M_elems[0xb] = 0;
      stab.m_backend.fpclass = cpp_dec_float_finite;
      stab.m_backend.prec_elem = 0x10;
      stab.m_backend.data._M_elems[0] = 0;
      stab.m_backend.data._M_elems[1] = 0;
      stab.m_backend.data._M_elems[2] = 0;
      stab.m_backend.data._M_elems[3] = 0;
      stab.m_backend.data._M_elems[4] = 0;
      stab.m_backend.data._M_elems[5] = 0;
      stab.m_backend.data._M_elems[6] = 0;
      stab.m_backend.data._M_elems[7] = 0;
      stab.m_backend.data._M_elems[0xc] = 0;
      stab.m_backend.data._M_elems[0xd] = 0;
      stab.m_backend.data._M_elems._56_5_ = 0;
      stab.m_backend.data._M_elems[0xf]._1_3_ = 0;
      stab.m_backend.exp = 0;
      stab.m_backend.neg = false;
      stab.m_backend.data._M_elems[8] = 0;
      stab.m_backend.data._M_elems[9] = 0;
      stab.m_backend.data._M_elems[10] = 0;
      stab.m_backend.data._M_elems[0xb] = 0;
      local_9c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_9c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_9c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      local_9c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6)
      ;
      local_9c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8)
      ;
      local_9c8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((val->m_backend).data._M_elems + 10);
      local_9c8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
      local_9c8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
      local_9c8.m_backend.exp = (val->m_backend).exp;
      local_9c8.m_backend.neg = (val->m_backend).neg;
      local_9c8.m_backend.fpclass = (val->m_backend).fpclass;
      local_9c8.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_b1c = leaveIdx;
      local_928 = (cpp_dec_float<100U,_int,_void> *)a;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)val,0.0);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_978,0.0);
      nBp = 0;
      minIdx = -1;
      absupd.m_backend.data._M_elems._0_8_ = (ulong)absupd.m_backend.data._M_elems[1] << 0x20;
      tVar20 = boost::multiprecision::operator>(&local_9c8,(int *)&absupd);
      local_920 = pnVar27;
      if (tVar20) {
        collectBreakpointsMax
                  (this,&nBp,&minIdx,local_b10,local_b34,upd_01,vec_01,pnVar27,low_01,PVEC);
        collectBreakpointsMax
                  (this,&nBp,&minIdx,(int *)local_b28,(int)local_b30,upd,vec,upp_00,low,COPVEC);
      }
      else {
        collectBreakpointsMin
                  (this,&nBp,&minIdx,local_b10,local_b34,upd_01,vec_01,pnVar27,low_01,PVEC);
        collectBreakpointsMin
                  (this,&nBp,&minIdx,(int *)local_b28,(int)local_b30,upd,vec,upp_00,low,COPVEC);
      }
      if (nBp == 0) {
        *(undefined8 *)((val->m_backend).data._M_elems + 0xc) =
             local_9c8.m_backend.data._M_elems._48_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 0xe) =
             local_9c8.m_backend.data._M_elems._56_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 8) =
             local_9c8.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 10) =
             local_9c8.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 4) =
             local_9c8.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 6) =
             local_9c8.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(val->m_backend).data._M_elems = local_9c8.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((val->m_backend).data._M_elems + 2) =
             local_9c8.m_backend.data._M_elems._8_8_;
        (val->m_backend).exp = local_9c8.m_backend.exp;
        (val->m_backend).neg = local_9c8.m_backend.neg;
        (val->m_backend).fpclass = local_9c8.m_backend.fpclass;
        (val->m_backend).prec_elem = local_9c8.m_backend.prec_elem;
        uVar23._0_4_ = enterId.super_DataKey.info;
        uVar23._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar23;
      }
      local_b28 = val;
      Breakpoint::operator=
                (&tmp,(this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start + minIdx);
      pBVar5 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Breakpoint::operator=(pBVar5 + minIdx,pBVar5);
      Breakpoint::operator=
                ((this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start,&tmp);
      lVar28 = (long)local_b1c;
      pnVar6 = (((this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver)->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)&pnVar6[lVar28].m_backend.data;
      uStack_80 = *(undefined8 *)((long)&pnVar6[lVar28].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x10);
      local_78 = *(undefined8 *)puVar1;
      uStack_70 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x20);
      local_68 = *(undefined8 *)puVar1;
      uStack_60 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x30);
      local_58 = *(undefined8 *)puVar1;
      uStack_50 = *(undefined8 *)(puVar1 + 2);
      local_48 = pnVar6[lVar28].m_backend.exp;
      local_44 = pnVar6[lVar28].m_backend.neg;
      local_40._0_4_ = pnVar6[lVar28].m_backend.fpclass;
      local_40._4_4_ = pnVar6[lVar28].m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&absupd,(multiprecision *)&local_88,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)CONCAT31((int3)((uint)local_48 >> 8),local_44));
      local_818.data._M_elems[0xc] = absupd.m_backend.data._M_elems[0xc];
      local_818.data._M_elems[0xd] = absupd.m_backend.data._M_elems[0xd];
      local_818.data._M_elems._56_5_ = absupd.m_backend.data._M_elems._56_5_;
      local_818.data._M_elems[0xf]._1_3_ = absupd.m_backend.data._M_elems[0xf]._1_3_;
      local_818.data._M_elems[8] = absupd.m_backend.data._M_elems[8];
      local_818.data._M_elems[9] = absupd.m_backend.data._M_elems[9];
      local_818.data._M_elems[10] = absupd.m_backend.data._M_elems[10];
      local_818.data._M_elems[0xb] = absupd.m_backend.data._M_elems[0xb];
      local_818.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
      local_818.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
      local_818.data._M_elems[6] = absupd.m_backend.data._M_elems[6];
      local_818.data._M_elems[7] = absupd.m_backend.data._M_elems[7];
      local_818.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
      local_818.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
      local_818.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
      local_818.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
      local_818.exp = absupd.m_backend.exp;
      local_818.neg = absupd.m_backend.neg;
      local_818.fpclass = absupd.m_backend.fpclass;
      local_818.prec_elem = absupd.m_backend.prec_elem;
      absupd.m_backend.data._M_elems._0_8_ =
           absupd.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar20 = boost::multiprecision::operator==
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_818,(int *)&absupd);
      if (tVar20) {
        pSVar3 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        local_d8 = *(undefined8 *)(pSVar3->instableLeaveVal).m_backend.data._M_elems;
        uStack_d0 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 2);
        local_c8 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 4);
        uStack_c0 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 6);
        local_b8 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 8);
        uStack_b0 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 10);
        local_a8 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 0xc);
        uStack_a0 = *(undefined8 *)((pSVar3->instableLeaveVal).m_backend.data._M_elems + 0xe);
        local_98 = (pSVar3->instableLeaveVal).m_backend.exp;
        local_94 = (pSVar3->instableLeaveVal).m_backend.neg;
        local_90._0_4_ = (pSVar3->instableLeaveVal).m_backend.fpclass;
        local_90._4_4_ = (pSVar3->instableLeaveVal).m_backend.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&absupd,(multiprecision *)&local_d8,arg);
        local_818.data._M_elems[0xc] = absupd.m_backend.data._M_elems[0xc];
        local_818.data._M_elems[0xd] = absupd.m_backend.data._M_elems[0xd];
        local_818.data._M_elems._56_5_ = absupd.m_backend.data._M_elems._56_5_;
        local_818.data._M_elems[0xf]._1_3_ = absupd.m_backend.data._M_elems[0xf]._1_3_;
        local_818.data._M_elems[8] = absupd.m_backend.data._M_elems[8];
        local_818.data._M_elems[9] = absupd.m_backend.data._M_elems[9];
        local_818.data._M_elems[10] = absupd.m_backend.data._M_elems[10];
        local_818.data._M_elems[0xb] = absupd.m_backend.data._M_elems[0xb];
        local_818.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
        local_818.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
        local_818.data._M_elems[6] = absupd.m_backend.data._M_elems[6];
        local_818.data._M_elems[7] = absupd.m_backend.data._M_elems[7];
        local_818.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
        local_818.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
        local_818.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
        local_818.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
        local_818.exp = absupd.m_backend.exp;
        local_818.neg = absupd.m_backend.neg;
        local_818.fpclass = absupd.m_backend.fpclass;
        local_818.prec_elem = absupd.m_backend.prec_elem;
      }
      local_838.entry =
           (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar28 = 0;
      pcVar36 = (cpp_dec_float<100U,_int,_void> *)0x0;
      iVar21 = 0;
      local_820 = this;
      while( true ) {
        iVar35 = (int)pcVar36;
        if (nBp <= iVar35) break;
        absupd.m_backend.data._M_elems._0_8_ =
             absupd.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar20 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_818,(int *)&absupd);
        if (!tVar20) break;
        if (iVar21 < iVar35) {
          iVar21 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                             ((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_838,iVar21 + 1,nBp,4,
                              0,0,true);
        }
        pSVar3 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar35 = *(int *)((long)(&pBVar7->val + 1) + lVar28);
        if (*(int *)((long)(&pBVar7->val + 1) + 4U + lVar28) == 0) {
          uVar29 = pSVar3->theRep *
                   ((pSVar3->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat)->data[iVar35];
          if (0 < (int)uVar29) {
            *(undefined4 *)((long)(&pBVar7->val + 1) + lVar28) = 0xffffffff;
            pUVar31 = pSVar3->thePvec;
            goto LAB_003827d2;
          }
          local_408 = *(undefined8 *)upd_01[iVar35].m_backend.data._M_elems;
          uStack_400 = *(undefined8 *)(upd_01[iVar35].m_backend.data._M_elems + 2);
          puVar1 = upd_01[iVar35].m_backend.data._M_elems + 4;
          local_3f8 = *(undefined8 *)puVar1;
          uStack_3f0 = *(undefined8 *)(puVar1 + 2);
          puVar1 = upd_01[iVar35].m_backend.data._M_elems + 8;
          local_3e8 = *(undefined8 *)puVar1;
          uStack_3e0 = *(undefined8 *)(puVar1 + 2);
          puVar1 = upd_01[iVar35].m_backend.data._M_elems + 0xc;
          local_3d8 = *(undefined8 *)puVar1;
          uStack_3d0 = *(undefined8 *)(puVar1 + 2);
          local_3c8 = upd_01[iVar35].m_backend.exp;
          local_3c4 = upd_01[iVar35].m_backend.neg;
          local_3c0._0_4_ = upd_01[iVar35].m_backend.fpclass;
          local_3c0._4_4_ = upd_01[iVar35].m_backend.prec_elem;
          local_b30 = pcVar36;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&absupd,(multiprecision *)&local_408,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)uVar29);
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems._56_5_ = 0;
          result.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar35].m_backend,&absupd.m_backend)
          ;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar35].m_backend,&absupd.m_backend)
          ;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x10;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems._56_5_ = 0;
          lowstab.m_backend.data._M_elems[0xf]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&lowstab.m_backend,&result.m_backend,&result_1.m_backend);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_818,&lowstab.m_backend);
          tVar20 = boost::multiprecision::operator>
                             (&absupd,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_978);
          pcVar36 = local_b30;
          if (tVar20) {
            local_978.data._M_elems[0xc] = absupd.m_backend.data._M_elems[0xc];
            local_978.data._M_elems[0xd] = absupd.m_backend.data._M_elems[0xd];
            local_978.data._M_elems._56_5_ = absupd.m_backend.data._M_elems._56_5_;
            local_978.data._M_elems[0xf]._1_3_ = absupd.m_backend.data._M_elems[0xf]._1_3_;
            local_978.data._M_elems[8] = absupd.m_backend.data._M_elems[8];
            local_978.data._M_elems[9] = absupd.m_backend.data._M_elems[9];
            local_978.data._M_elems[10] = absupd.m_backend.data._M_elems[10];
            local_978.data._M_elems[0xb] = absupd.m_backend.data._M_elems[0xb];
            local_978.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
            local_978.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
            local_978.data._M_elems[6] = absupd.m_backend.data._M_elems[6];
            local_978.data._M_elems[7] = absupd.m_backend.data._M_elems[7];
            local_978.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
            local_978.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
            local_978.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
            local_978.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
            local_978.exp = absupd.m_backend.exp;
            local_978.neg = absupd.m_backend.neg;
            local_978.fpclass = absupd.m_backend.fpclass;
            local_978.prec_elem = absupd.m_backend.prec_elem;
          }
        }
        else {
          uVar29 = pSVar3->theRep *
                   ((pSVar3->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat)->data[iVar35];
          if ((int)uVar29 < 1) {
            local_458 = *(undefined8 *)upd[iVar35].m_backend.data._M_elems;
            uStack_450 = *(undefined8 *)(upd[iVar35].m_backend.data._M_elems + 2);
            puVar1 = upd[iVar35].m_backend.data._M_elems + 4;
            local_448 = *(undefined8 *)puVar1;
            uStack_440 = *(undefined8 *)(puVar1 + 2);
            puVar1 = upd[iVar35].m_backend.data._M_elems + 8;
            local_438 = *(undefined8 *)puVar1;
            uStack_430 = *(undefined8 *)(puVar1 + 2);
            puVar1 = upd[iVar35].m_backend.data._M_elems + 0xc;
            local_428 = *(undefined8 *)puVar1;
            uStack_420 = *(undefined8 *)(puVar1 + 2);
            local_418 = upd[iVar35].m_backend.exp;
            local_414 = upd[iVar35].m_backend.neg;
            local_410._0_4_ = upd[iVar35].m_backend.fpclass;
            local_410._4_4_ = upd[iVar35].m_backend.prec_elem;
            local_b30 = pcVar36;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&absupd,(multiprecision *)&local_458,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)uVar29);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems._56_5_ = 0;
            result.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result.m_backend,
                       &(((this->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar35].m_backend,
                       &absupd.m_backend);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,
                       &(((this->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver)->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar35].m_backend,
                       &absupd.m_backend);
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x10;
            lowstab.m_backend.data._M_elems[0] = 0;
            lowstab.m_backend.data._M_elems[1] = 0;
            lowstab.m_backend.data._M_elems[2] = 0;
            lowstab.m_backend.data._M_elems[3] = 0;
            lowstab.m_backend.data._M_elems[4] = 0;
            lowstab.m_backend.data._M_elems[5] = 0;
            lowstab.m_backend.data._M_elems[6] = 0;
            lowstab.m_backend.data._M_elems[7] = 0;
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems._56_5_ = 0;
            lowstab.m_backend.data._M_elems[0xf]._1_3_ = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&lowstab.m_backend,&result.m_backend,&result_1.m_backend);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_818,&lowstab.m_backend);
            tVar20 = boost::multiprecision::operator>
                               (&absupd,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_978);
            this = local_820;
            pcVar36 = local_b30;
            if (tVar20) {
              local_978.data._M_elems[0xc] = absupd.m_backend.data._M_elems[0xc];
              local_978.data._M_elems[0xd] = absupd.m_backend.data._M_elems[0xd];
              local_978.data._M_elems._56_5_ = absupd.m_backend.data._M_elems._56_5_;
              local_978.data._M_elems[0xf]._1_3_ = absupd.m_backend.data._M_elems[0xf]._1_3_;
              local_978.data._M_elems[8] = absupd.m_backend.data._M_elems[8];
              local_978.data._M_elems[9] = absupd.m_backend.data._M_elems[9];
              local_978.data._M_elems[10] = absupd.m_backend.data._M_elems[10];
              local_978.data._M_elems[0xb] = absupd.m_backend.data._M_elems[0xb];
              local_978.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
              local_978.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
              local_978.data._M_elems[6] = absupd.m_backend.data._M_elems[6];
              local_978.data._M_elems[7] = absupd.m_backend.data._M_elems[7];
              local_978.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
              local_978.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
              local_978.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
              local_978.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
              local_978.exp = absupd.m_backend.exp;
              local_978.neg = absupd.m_backend.neg;
              local_978.fpclass = absupd.m_backend.fpclass;
              local_978.prec_elem = absupd.m_backend.prec_elem;
            }
          }
          else {
            *(undefined4 *)((long)(&pBVar7->val + 1) + lVar28) = 0xffffffff;
            pUVar31 = pSVar3->theCoPvec;
LAB_003827d2:
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clearIdx(&pUVar31->thedelta,iVar35);
          }
        }
        pcVar36 = (cpp_dec_float<100U,_int,_void> *)((long)pcVar36 + 1);
        lVar28 = lVar28 + 0x58;
      }
      lVar34 = (long)pcVar36 - 1;
      local_afc = (uint)lVar34;
      local_b30 = &(this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .delta.m_backend;
      tVar20 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_818,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_b30);
      if ((!tVar20) || (iVar35 < nBp)) {
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)&pBVar7[-1].val.m_backend + lVar28);
        absupd.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        absupd.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pBVar7->val).m_backend + lVar28 + -0x48);
        absupd.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        absupd.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pBVar7->val).m_backend + lVar28 + -0x38);
        absupd.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        absupd.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pBVar7->val).m_backend + lVar28 + -0x28);
        absupd.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        absupd.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        absupd.m_backend.exp = *(int *)((long)&(pBVar7->val).m_backend + lVar28 + -0x18);
        absupd.m_backend.neg = *(bool *)((long)&(pBVar7->val).m_backend + lVar28 + -0x14);
        absupd.m_backend._72_8_ = *(undefined8 *)((long)&(pBVar7->val).m_backend + lVar28 + -0x10);
        local_b38 = 0xffffffff;
        local_828 = lVar34;
LAB_00382d96:
        lVar33 = lVar34 * 0x58 + 0xa8;
        lVar28 = lVar34;
        do {
          lVar34 = lVar28 + 1;
          if (nBp <= lVar34) goto LAB_003835fa;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&lowstab.m_backend,0,(type *)0x0);
          if (iVar21 <= lVar28) {
            iVar21 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                               ((this->breakpoints).data.
                                super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                ._M_impl.super__Vector_impl_data._M_start,&local_838,iVar21 + 1,nBp,
                                4,0,0,true);
          }
          pSVar3 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pBVar7 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar35 = *(int *)((long)&(pBVar7->val).m_backend + lVar33);
          if (*(int *)((long)&(pBVar7->val).m_backend + lVar33 + 4) == 0) {
            if (pSVar3->theRep *
                ((pSVar3->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat)->data[iVar35] < 1) {
              result.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)upd_01[iVar35].m_backend.data._M_elems;
              result.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(upd_01[iVar35].m_backend.data._M_elems + 2);
              puVar1 = upd_01[iVar35].m_backend.data._M_elems + 4;
              result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = upd_01[iVar35].m_backend.data._M_elems + 8;
              result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
              result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = upd_01[iVar35].m_backend.data._M_elems + 0xc;
              result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
              uStack_5b0 = *(undefined8 *)(puVar1 + 2);
              result.m_backend.data._M_elems._56_5_ = SUB85(uStack_5b0,0);
              result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uStack_5b0 >> 0x28);
              result.m_backend.exp = upd_01[iVar35].m_backend.exp;
              result.m_backend.neg = upd_01[iVar35].m_backend.neg;
              local_5a0 = upd_01[iVar35].m_backend.fpclass;
              local_59c = upd_01[iVar35].m_backend.prec_elem;
              result.m_backend.prec_elem = local_59c;
              result.m_backend.fpclass = local_5a0;
              local_5e8 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
              auStack_5e0 = (uint  [2])result.m_backend.data._M_elems._8_8_;
              local_5d8 = (uint  [2])result.m_backend.data._M_elems._16_8_;
              auStack_5d0 = (uint  [2])result.m_backend.data._M_elems._24_8_;
              local_5c8 = (uint  [2])result.m_backend.data._M_elems._32_8_;
              auStack_5c0 = (uint  [2])result.m_backend.data._M_elems._40_8_;
              local_5b8 = (uint  [2])result.m_backend.data._M_elems._48_8_;
              local_5a8 = result.m_backend.exp;
              local_5a4 = result.m_backend.neg;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&result_1,local_5e8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)(ulong)local_5a0);
              tVar20 = boost::multiprecision::operator>
                                 (&result_1,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_978);
              if (!tVar20) goto LAB_00383593;
              pSVar3 = (this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver;
              pSVar8 = pSVar3->thevectors;
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator*(&result_1,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((pSVar8->set).theitem + (pSVar8->set).thekey[iVar35].idx),
                          &pSVar3->theCoPvec->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         );
              pnVar6 = (((this->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .thesolver)->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x30) =
                   result_1.m_backend.data._M_elems._48_8_;
              *(ulong *)((long)(pnVar6 + iVar35) + 0x38) =
                   CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                            result_1.m_backend.data._M_elems._56_5_);
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x20) =
                   result_1.m_backend.data._M_elems._32_8_;
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x28) =
                   result_1.m_backend.data._M_elems._40_8_;
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x10) =
                   result_1.m_backend.data._M_elems._16_8_;
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x18) =
                   result_1.m_backend.data._M_elems._24_8_;
              *(undefined8 *)&pnVar6[iVar35].m_backend = result_1.m_backend.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar6[iVar35].m_backend + 8) =
                   result_1.m_backend.data._M_elems._8_8_;
              *(int *)((long)(pnVar6 + iVar35) + 0x40) = result_1.m_backend.exp;
              *(bool *)((long)(pnVar6 + iVar35) + 0x44) = result_1.m_backend.neg;
              *(undefined8 *)((long)(pnVar6 + iVar35) + 0x48) = result_1.m_backend._72_8_;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              tVar20 = boost::multiprecision::operator>(&result,(double *)&result_1);
              pnVar27 = low_01;
              if (tVar20) {
                pnVar27 = local_920;
              }
              lowstab.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)pnVar27[iVar35].m_backend.data._M_elems;
              lowstab.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar27[iVar35].m_backend.data._M_elems + 2);
              puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 4;
              lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              lowstab.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 8;
              lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
              lowstab.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 0xc;
              lowstab.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
              uVar23 = *(undefined8 *)(puVar1 + 2);
              lowstab.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
              lowstab.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
              lowstab.m_backend.exp = pnVar27[iVar35].m_backend.exp;
              lowstab.m_backend.neg = pnVar27[iVar35].m_backend.neg;
              lowstab.m_backend.fpclass = pnVar27[iVar35].m_backend.fpclass;
              lowstab.m_backend.prec_elem = pnVar27[iVar35].m_backend.prec_elem;
              result_6.m_backend.fpclass = cpp_dec_float_finite;
              result_6.m_backend.prec_elem = 0x10;
              result_6.m_backend.data._M_elems[0] = 0;
              result_6.m_backend.data._M_elems[1] = 0;
              result_6.m_backend.data._M_elems[2] = 0;
              result_6.m_backend.data._M_elems[3] = 0;
              result_6.m_backend.data._M_elems[4] = 0;
              result_6.m_backend.data._M_elems[5] = 0;
              result_6.m_backend.data._M_elems[6] = 0;
              result_6.m_backend.data._M_elems[7] = 0;
              result_6.m_backend.data._M_elems[8] = 0;
              result_6.m_backend.data._M_elems[9] = 0;
              result_6.m_backend.data._M_elems[10] = 0;
              result_6.m_backend.data._M_elems[0xb] = 0;
              result_6.m_backend.data._M_elems[0xc] = 0;
              result_6.m_backend.data._M_elems[0xd] = 0;
              result_6.m_backend.data._M_elems._56_5_ = 0;
              result_6.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_6.m_backend.exp = 0;
              result_6.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&result_6.m_backend,&lowstab.m_backend,&vec_01[iVar35].m_backend);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems._56_5_ = 0;
              result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&result_1.m_backend,&result_6.m_backend,&result.m_backend);
              lowstab.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
              lowstab.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
              lowstab.m_backend.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
              lowstab.m_backend.data._M_elems[0xf]._1_3_ =
                   result_1.m_backend.data._M_elems[0xf]._1_3_;
              lowstab.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
              lowstab.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
              lowstab.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
              lowstab.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
              lowstab.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              lowstab.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              lowstab.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
              lowstab.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
              lowstab.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              lowstab.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              lowstab.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              lowstab.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              lowstab.m_backend.exp = result_1.m_backend.exp;
              lowstab.m_backend.neg = result_1.m_backend.neg;
              lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
              lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
              tVar20 = boost::multiprecision::operator<=(&lowstab,&absupd);
              if (!tVar20) goto LAB_00383593;
              uStack_470 = CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,
                                    result.m_backend.data._M_elems._56_5_);
              local_4a8 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
              auStack_4a0[0] = result.m_backend.data._M_elems[2];
              auStack_4a0[1] = result.m_backend.data._M_elems[3];
              local_498[0] = result.m_backend.data._M_elems[4];
              local_498[1] = result.m_backend.data._M_elems[5];
              auStack_490[0] = result.m_backend.data._M_elems[6];
              auStack_490[1] = result.m_backend.data._M_elems[7];
              local_488[0] = result.m_backend.data._M_elems[8];
              local_488[1] = result.m_backend.data._M_elems[9];
              auStack_480[0] = result.m_backend.data._M_elems[10];
              auStack_480[1] = result.m_backend.data._M_elems[0xb];
              local_478[0] = result.m_backend.data._M_elems[0xc];
              local_478[1] = result.m_backend.data._M_elems[0xd];
              local_468 = result.m_backend.exp;
              local_464 = result.m_backend.neg;
              local_460 = result.m_backend.fpclass;
              iStack_45c = result.m_backend.prec_elem;
              this_00 = local_4a8;
              pnVar27 = extraout_RDX_00;
              goto LAB_0038351d;
            }
            *(undefined4 *)((long)&(pBVar7->val).m_backend + lVar33) = 0xffffffff;
            pUVar31 = pSVar3->thePvec;
          }
          else {
            if (pSVar3->theRep *
                ((pSVar3->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.costat)->data[iVar35] < 1) goto LAB_00382e75;
            *(undefined4 *)((long)&(pBVar7->val).m_backend + lVar33) = 0xffffffff;
            pUVar31 = pSVar3->theCoPvec;
          }
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearIdx(&pUVar31->thedelta,iVar35);
          lVar33 = lVar33 + 0x58;
          lVar28 = lVar34;
        } while( true );
      }
      absupd.m_backend.data._M_elems[0] = 0;
      absupd.m_backend.data._M_elems[1] = 0x3fe00000;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (local_928,(double *)&absupd);
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 0xc) =
           local_9c8.m_backend.data._M_elems._48_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 0xe) =
           local_9c8.m_backend.data._M_elems._56_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 8) =
           local_9c8.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 10) =
           local_9c8.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 4) =
           local_9c8.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 6) =
           local_9c8.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(local_b28->m_backend).data._M_elems = local_9c8.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((local_b28->m_backend).data._M_elems + 2) =
           local_9c8.m_backend.data._M_elems._8_8_;
      (local_b28->m_backend).exp = local_9c8.m_backend.exp;
      (local_b28->m_backend).neg = local_9c8.m_backend.neg;
      (local_b28->m_backend).fpclass = local_9c8.m_backend.fpclass;
      (local_b28->m_backend).prec_elem = local_9c8.m_backend.prec_elem;
      polish = false;
      val = local_b28;
      leaveIdx = local_b1c;
    }
  }
  DVar22 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::selectEnter(&this->
                                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,val,leaveIdx,polish);
  uVar26._0_4_ = DVar22.info;
  uVar26._4_4_ = DVar22.idx;
  return (SPxId)uVar26;
LAB_00382e75:
  result.m_backend.data._M_elems._0_8_ = *(undefined8 *)upd[iVar35].m_backend.data._M_elems;
  result.m_backend.data._M_elems._8_8_ = *(undefined8 *)(upd[iVar35].m_backend.data._M_elems + 2);
  puVar1 = upd[iVar35].m_backend.data._M_elems + 4;
  result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = upd[iVar35].m_backend.data._M_elems + 8;
  result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = upd[iVar35].m_backend.data._M_elems + 0xc;
  result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  uStack_600 = *(undefined8 *)(puVar1 + 2);
  result.m_backend.data._M_elems._56_5_ = SUB85(uStack_600,0);
  result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uStack_600 >> 0x28);
  result.m_backend.exp = upd[iVar35].m_backend.exp;
  result.m_backend.neg = upd[iVar35].m_backend.neg;
  local_5f0 = upd[iVar35].m_backend.fpclass;
  local_5ec = upd[iVar35].m_backend.prec_elem;
  result.m_backend.prec_elem = local_5ec;
  result.m_backend.fpclass = local_5f0;
  local_638 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
  auStack_630 = (uint  [2])result.m_backend.data._M_elems._8_8_;
  local_628 = (uint  [2])result.m_backend.data._M_elems._16_8_;
  auStack_620 = (uint  [2])result.m_backend.data._M_elems._24_8_;
  local_618 = (uint  [2])result.m_backend.data._M_elems._32_8_;
  auStack_610 = (uint  [2])result.m_backend.data._M_elems._40_8_;
  local_608 = (uint  [2])result.m_backend.data._M_elems._48_8_;
  local_5f8 = result.m_backend.exp;
  local_5f4 = result.m_backend.neg;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((type *)&result_1.m_backend,local_638,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(ulong)local_5f0);
  tVar20 = boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_1.m_backend,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_978);
  if (tVar20) {
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    tVar20 = boost::multiprecision::operator>(&result,(double *)&result_1.m_backend);
    pnVar27 = low;
    if (tVar20) {
      pnVar27 = upp_00;
    }
    lowstab.m_backend.data._M_elems._0_8_ = *(undefined8 *)pnVar27[iVar35].m_backend.data._M_elems;
    lowstab.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar27[iVar35].m_backend.data._M_elems + 2);
    puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 4;
    lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    lowstab.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 8;
    lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    lowstab.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar27[iVar35].m_backend.data._M_elems + 0xc;
    lowstab.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    lowstab.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
    lowstab.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
    lowstab.m_backend.exp = pnVar27[iVar35].m_backend.exp;
    lowstab.m_backend.neg = pnVar27[iVar35].m_backend.neg;
    lowstab.m_backend.fpclass = pnVar27[iVar35].m_backend.fpclass;
    lowstab.m_backend.prec_elem = pnVar27[iVar35].m_backend.prec_elem;
    result_6.m_backend.fpclass = cpp_dec_float_finite;
    result_6.m_backend.prec_elem = 0x10;
    result_6.m_backend.data._M_elems[0] = 0;
    result_6.m_backend.data._M_elems[1] = 0;
    result_6.m_backend.data._M_elems[2] = 0;
    result_6.m_backend.data._M_elems[3] = 0;
    result_6.m_backend.data._M_elems[4] = 0;
    result_6.m_backend.data._M_elems[5] = 0;
    result_6.m_backend.data._M_elems[6] = 0;
    result_6.m_backend.data._M_elems[7] = 0;
    result_6.m_backend.data._M_elems[8] = 0;
    result_6.m_backend.data._M_elems[9] = 0;
    result_6.m_backend.data._M_elems[10] = 0;
    result_6.m_backend.data._M_elems[0xb] = 0;
    result_6.m_backend.data._M_elems[0xc] = 0;
    result_6.m_backend.data._M_elems[0xd] = 0;
    result_6.m_backend.data._M_elems._56_5_ = 0;
    result_6.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_6.m_backend.exp = 0;
    result_6.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_6.m_backend,&lowstab.m_backend,&vec[iVar35].m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems._56_5_ = 0;
    result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,&result_6.m_backend,&result.m_backend);
    lowstab.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
    lowstab.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
    lowstab.m_backend.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
    lowstab.m_backend.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
    lowstab.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
    lowstab.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
    lowstab.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
    lowstab.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
    lowstab.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    lowstab.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    lowstab.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    lowstab.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    lowstab.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    lowstab.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    lowstab.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    lowstab.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    lowstab.m_backend.exp = result_1.m_backend.exp;
    lowstab.m_backend.neg = result_1.m_backend.neg;
    lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
    lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
    tVar20 = boost::multiprecision::operator<=(&lowstab,&absupd);
    if (tVar20) {
      uStack_4c0 = CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,
                            result.m_backend.data._M_elems._56_5_);
      local_4f8 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
      auStack_4f0[0] = result.m_backend.data._M_elems[2];
      auStack_4f0[1] = result.m_backend.data._M_elems[3];
      local_4e8[0] = result.m_backend.data._M_elems[4];
      local_4e8[1] = result.m_backend.data._M_elems[5];
      auStack_4e0[0] = result.m_backend.data._M_elems[6];
      auStack_4e0[1] = result.m_backend.data._M_elems[7];
      local_4d8[0] = result.m_backend.data._M_elems[8];
      local_4d8[1] = result.m_backend.data._M_elems[9];
      auStack_4d0[0] = result.m_backend.data._M_elems[10];
      auStack_4d0[1] = result.m_backend.data._M_elems[0xb];
      local_4c8[0] = result.m_backend.data._M_elems[0xc];
      local_4c8[1] = result.m_backend.data._M_elems[0xd];
      local_4b8 = result.m_backend.exp;
      local_4b4 = result.m_backend.neg;
      local_4b0 = result.m_backend.fpclass;
      iStack_4ac = result.m_backend.prec_elem;
      this_00 = local_4f8;
      pnVar27 = extraout_RDX;
LAB_0038351d:
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1,this_00,pnVar27);
      local_978.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
      local_978.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
      local_978.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
      local_978.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
      local_978.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
      local_978.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
      local_978.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
      local_978.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
      local_978.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_978.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_978.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
      local_978.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
      local_978.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_978.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_978.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_978.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_978.exp = result_1.m_backend.exp;
      local_978.neg = result_1.m_backend.neg;
      local_978.fpclass = result_1.m_backend.fpclass;
      local_978.prec_elem = result_1.m_backend.prec_elem;
      local_b38 = (uint)lVar34;
    }
  }
LAB_00383593:
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&result.m_backend,local_b30,&absupd.m_backend);
  tVar20 = boost::multiprecision::operator>
                     (&lowstab,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
  if (tVar20) goto LAB_003835fa;
  goto LAB_00382d96;
LAB_003835fa:
  pnVar27 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).fastDelta;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems[6] = 0;
  lowstab.m_backend.data._M_elems[7] = 0;
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems._56_5_ = 0;
  lowstab.m_backend.data._M_elems[0xf]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&lowstab.m_backend,&pnVar27->m_backend,&local_978);
  uVar18 = lowstab.m_backend.data._M_elems._48_8_;
  uVar16 = lowstab.m_backend.data._M_elems._40_8_;
  uVar14 = lowstab.m_backend.data._M_elems._32_8_;
  uVar26 = lowstab.m_backend.data._M_elems._24_8_;
  uVar24 = lowstab.m_backend.data._M_elems._16_8_;
  uVar25 = lowstab.m_backend.data._M_elems._8_8_;
  uVar23 = lowstab.m_backend.data._M_elems._0_8_;
  uVar9._5_3_ = lowstab.m_backend.data._M_elems[0xf]._1_3_;
  uVar9._0_5_ = lowstab.m_backend.data._M_elems._56_5_;
  local_b18 = lowstab.m_backend.exp;
  local_b10 = (int *)CONCAT71(local_b10._1_7_,lowstab.m_backend.neg);
  local_b34 = lowstab.m_backend.fpclass;
  local_b30 = (cpp_dec_float<100U,_int,_void> *)
              CONCAT44(local_b30._4_4_,lowstab.m_backend.prec_elem);
  bVar38 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableLeave;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
             &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar40 = -(ulong)(*(double *)(result.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&lowstab.m_backend,
             (double)(~uVar40 & (ulong)(*(double *)(result.m_backend.data._M_elems._0_8_ + 0x40) *
                                       1e-10) | uVar40 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2));
  local_830 = pnVar27;
  if (bVar38 == false) {
    local_128.m_backend.data._M_elems[0xf]._1_3_ = local_978.data._M_elems[0xf]._1_3_;
    local_128.m_backend.data._M_elems._56_5_ = local_978.data._M_elems._56_5_;
    local_128.m_backend.data._M_elems[0xc] = local_978.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = local_978.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[8] = local_978.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_978.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = local_978.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = local_978.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[4] = local_978.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_978.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_978.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_978.data._M_elems[7];
    local_128.m_backend.data._M_elems[0] = local_978.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_978.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_978.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_978.data._M_elems[3];
    local_128.m_backend.exp = local_978.exp;
    local_128.m_backend.neg = local_978.neg;
    local_128.m_backend.fpclass = local_978.fpclass;
    local_128.m_backend.prec_elem = local_978.prec_elem;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result,&this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_128);
    pnVar27 = &result;
    fVar37 = result.m_backend.fpclass;
  }
  else {
    result.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
    result.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
    result.m_backend.data._M_elems._56_5_ = lowstab.m_backend.data._M_elems._56_5_;
    result.m_backend.data._M_elems[0xf]._1_3_ = lowstab.m_backend.data._M_elems[0xf]._1_3_;
    result.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
    result.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
    result.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
    result.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    result.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    result.m_backend.exp = lowstab.m_backend.exp;
    result.m_backend.neg = lowstab.m_backend.neg;
    result.m_backend.fpclass = lowstab.m_backend.fpclass;
    pnVar27 = &lowstab;
    fVar37 = lowstab.m_backend.fpclass;
  }
  bVar38 = result.m_backend.neg;
  iVar2 = (pnVar27->m_backend).prec_elem;
  stab.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
  stab.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
  stab.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
  stab.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
  stab.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
  stab.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
  stab.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
  stab.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
  stab.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  stab.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  stab.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
  stab.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
  stab.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  stab.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  stab.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  stab.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  stab.m_backend.prec_elem = iVar2;
  stab.m_backend.fpclass = fVar37;
  stab.m_backend.exp = result.m_backend.exp;
  stab.m_backend.neg = result.m_backend.neg;
  if ((int)local_b38 < 0) {
    bVar39 = false;
    local_b38 = result.m_backend.exp;
    while ((uVar19 = lowstab.m_backend.data._M_elems._48_8_,
           uVar17 = lowstab.m_backend.data._M_elems._40_8_,
           uVar15 = lowstab.m_backend.data._M_elems._32_8_,
           uVar13 = lowstab.m_backend.data._M_elems._24_8_,
           uVar12 = lowstab.m_backend.data._M_elems._16_8_,
           uVar11 = lowstab.m_backend.data._M_elems._8_8_,
           uVar10 = lowstab.m_backend.data._M_elems._0_8_, uVar29 = (uint)pcVar36, bVar39 == false
           && (uVar30 = uVar29 - 1, -1 < (int)uVar30))) {
      pBVar7 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = pBVar7[uVar30].idx;
      if (iVar21 < 0) {
        bVar39 = false;
      }
      else {
        bVar39 = pBVar7[uVar30].src == PVEC;
        if (bVar39) {
          local_688.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
          local_688.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
          local_688.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
          local_688.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
          local_688.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
          local_688.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
          local_688.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
          local_688.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
          local_688.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
          local_688.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
          local_688.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
          local_688.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
          local_688.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
          local_688.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
          local_688.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
          local_688.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
          local_688.m_backend.exp = local_b38;
          lowstab.m_backend.data._M_elems[0] = (uint)uVar23;
          lowstab.m_backend.data._M_elems[1] = SUB84(uVar23,4);
          local_6d8.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
          local_6d8.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
          lowstab.m_backend.data._M_elems[2] = (uint)uVar25;
          lowstab.m_backend.data._M_elems[3] = SUB84(uVar25,4);
          local_6d8.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
          local_6d8.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
          lowstab.m_backend.data._M_elems[4] = (uint)uVar24;
          lowstab.m_backend.data._M_elems[5] = SUB84(uVar24,4);
          local_6d8.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
          local_6d8.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
          lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
          lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
          local_6d8.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
          local_6d8.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
          lowstab.m_backend.data._M_elems[8] = (uint)uVar14;
          lowstab.m_backend.data._M_elems[9] = SUB84(uVar14,4);
          local_6d8.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
          local_6d8.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
          lowstab.m_backend.data._M_elems[10] = (uint)uVar16;
          lowstab.m_backend.data._M_elems[0xb] = SUB84(uVar16,4);
          local_6d8.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
          local_6d8.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
          lowstab.m_backend.data._M_elems[0xc] = (uint)uVar18;
          lowstab.m_backend.data._M_elems[0xd] = SUB84(uVar18,4);
          local_6d8.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
          local_6d8.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
          local_6d8.m_backend.exp = local_b18;
          local_6d8.m_backend.neg = (bool)local_b10._0_1_;
          local_6d8.m_backend.fpclass = local_b34;
          local_6d8.m_backend.prec_elem = (int)local_b30;
          local_548.m_backend.data._M_elems[0] = local_9c8.m_backend.data._M_elems[0];
          local_548.m_backend.data._M_elems[1] = local_9c8.m_backend.data._M_elems[1];
          local_548.m_backend.data._M_elems[2] = local_9c8.m_backend.data._M_elems[2];
          local_548.m_backend.data._M_elems[3] = local_9c8.m_backend.data._M_elems[3];
          local_548.m_backend.data._M_elems[4] = local_9c8.m_backend.data._M_elems[4];
          local_548.m_backend.data._M_elems[5] = local_9c8.m_backend.data._M_elems[5];
          local_548.m_backend.data._M_elems[6] = local_9c8.m_backend.data._M_elems[6];
          local_548.m_backend.data._M_elems[7] = local_9c8.m_backend.data._M_elems[7];
          local_548.m_backend.data._M_elems[8] = local_9c8.m_backend.data._M_elems[8];
          local_548.m_backend.data._M_elems[9] = local_9c8.m_backend.data._M_elems[9];
          local_548.m_backend.data._M_elems[10] = local_9c8.m_backend.data._M_elems[10];
          local_548.m_backend.data._M_elems[0xb] = local_9c8.m_backend.data._M_elems[0xb];
          local_548.m_backend.data._M_elems[0xc] = local_9c8.m_backend.data._M_elems[0xc];
          local_548.m_backend.data._M_elems[0xd] = local_9c8.m_backend.data._M_elems[0xd];
          local_548.m_backend.data._M_elems[0xe] = local_9c8.m_backend.data._M_elems[0xe];
          local_548.m_backend.data._M_elems[0xf] = local_9c8.m_backend.data._M_elems[0xf];
          local_548.m_backend.exp = local_9c8.m_backend.exp;
          local_548.m_backend.neg = local_9c8.m_backend.neg;
          local_548.m_backend.fpclass = local_9c8.m_backend.fpclass;
          local_548.m_backend.prec_elem = local_9c8.m_backend.prec_elem;
          pnVar27 = &local_688;
          pnVar32 = &local_6d8;
          pnVar41 = &local_548;
          upd_00 = upd_01;
          vec_00 = vec_01;
          low_00 = low_01;
          upp = local_920;
          local_6d8.m_backend.data._M_elems._56_8_ = uVar9;
          local_688.m_backend.neg = bVar38;
          local_688.m_backend.fpclass = fVar37;
          local_688.m_backend.prec_elem = iVar2;
        }
        else {
          local_728.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
          local_728.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
          local_728.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
          local_728.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
          local_728.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
          local_728.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
          local_728.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
          local_728.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
          local_728.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
          local_728.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
          local_728.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
          local_728.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
          local_728.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
          local_728.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
          local_728.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
          local_728.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
          local_728.m_backend.exp = local_b38;
          lowstab.m_backend.data._M_elems[0] = (uint)uVar23;
          lowstab.m_backend.data._M_elems[1] = SUB84(uVar23,4);
          local_778.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
          local_778.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
          lowstab.m_backend.data._M_elems[2] = (uint)uVar25;
          lowstab.m_backend.data._M_elems[3] = SUB84(uVar25,4);
          local_778.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
          local_778.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
          lowstab.m_backend.data._M_elems[4] = (uint)uVar24;
          lowstab.m_backend.data._M_elems[5] = SUB84(uVar24,4);
          local_778.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
          local_778.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
          lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
          lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
          local_778.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
          local_778.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
          lowstab.m_backend.data._M_elems[8] = (uint)uVar14;
          lowstab.m_backend.data._M_elems[9] = SUB84(uVar14,4);
          local_778.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
          local_778.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
          lowstab.m_backend.data._M_elems[10] = (uint)uVar16;
          lowstab.m_backend.data._M_elems[0xb] = SUB84(uVar16,4);
          local_778.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
          local_778.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
          lowstab.m_backend.data._M_elems[0xc] = (uint)uVar18;
          lowstab.m_backend.data._M_elems[0xd] = SUB84(uVar18,4);
          local_778.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
          local_778.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
          local_778.m_backend.exp = local_b18;
          local_778.m_backend.neg = (bool)local_b10._0_1_;
          local_778.m_backend.fpclass = local_b34;
          local_778.m_backend.prec_elem = (int)local_b30;
          local_598.m_backend.data._M_elems[0] = local_9c8.m_backend.data._M_elems[0];
          local_598.m_backend.data._M_elems[1] = local_9c8.m_backend.data._M_elems[1];
          local_598.m_backend.data._M_elems[2] = local_9c8.m_backend.data._M_elems[2];
          local_598.m_backend.data._M_elems[3] = local_9c8.m_backend.data._M_elems[3];
          local_598.m_backend.data._M_elems[4] = local_9c8.m_backend.data._M_elems[4];
          local_598.m_backend.data._M_elems[5] = local_9c8.m_backend.data._M_elems[5];
          local_598.m_backend.data._M_elems[6] = local_9c8.m_backend.data._M_elems[6];
          local_598.m_backend.data._M_elems[7] = local_9c8.m_backend.data._M_elems[7];
          local_598.m_backend.data._M_elems[8] = local_9c8.m_backend.data._M_elems[8];
          local_598.m_backend.data._M_elems[9] = local_9c8.m_backend.data._M_elems[9];
          local_598.m_backend.data._M_elems[10] = local_9c8.m_backend.data._M_elems[10];
          local_598.m_backend.data._M_elems[0xb] = local_9c8.m_backend.data._M_elems[0xb];
          local_598.m_backend.data._M_elems[0xc] = local_9c8.m_backend.data._M_elems[0xc];
          local_598.m_backend.data._M_elems[0xd] = local_9c8.m_backend.data._M_elems[0xd];
          local_598.m_backend.data._M_elems[0xe] = local_9c8.m_backend.data._M_elems[0xe];
          local_598.m_backend.data._M_elems[0xf] = local_9c8.m_backend.data._M_elems[0xf];
          local_598.m_backend.exp = local_9c8.m_backend.exp;
          local_598.m_backend.neg = local_9c8.m_backend.neg;
          local_598.m_backend.fpclass = local_9c8.m_backend.fpclass;
          local_598.m_backend.prec_elem = local_9c8.m_backend.prec_elem;
          pnVar27 = &local_728;
          pnVar32 = &local_778;
          pnVar41 = &local_598;
          upd_00 = upd;
          vec_00 = vec;
          low_00 = low;
          upp = upp_00;
          local_778.m_backend.data._M_elems._56_8_ = uVar9;
          local_728.m_backend.neg = bVar38;
          local_728.m_backend.fpclass = fVar37;
          local_728.m_backend.prec_elem = iVar2;
        }
        lowstab.m_backend.data._M_elems._0_8_ = uVar10;
        lowstab.m_backend.data._M_elems._8_8_ = uVar11;
        lowstab.m_backend.data._M_elems._16_8_ = uVar12;
        lowstab.m_backend.data._M_elems._24_8_ = uVar13;
        lowstab.m_backend.data._M_elems._32_8_ = uVar15;
        lowstab.m_backend.data._M_elems._40_8_ = uVar17;
        lowstab.m_backend.data._M_elems._48_8_ = uVar19;
        bVar39 = getData(this,local_b28,&enterId,iVar21,pnVar27,pnVar32,upd_00,vec_00,low_00,upp,
                         (uint)!bVar39,pnVar41);
      }
      local_afc = uVar29 - 2;
      pcVar36 = (cpp_dec_float<100U,_int,_void> *)(ulong)uVar30;
    }
    iVar21 = local_b1c;
    local_afc = uVar29;
    if (bVar39 == false) goto LAB_00383f81;
  }
  else {
    tVar20 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_978,&stab);
    uVar19 = lowstab.m_backend.data._M_elems._48_8_;
    uVar17 = lowstab.m_backend.data._M_elems._40_8_;
    uVar15 = lowstab.m_backend.data._M_elems._32_8_;
    uVar13 = lowstab.m_backend.data._M_elems._24_8_;
    uVar12 = lowstab.m_backend.data._M_elems._16_8_;
    uVar11 = lowstab.m_backend.data._M_elems._8_8_;
    uVar10 = lowstab.m_backend.data._M_elems._0_8_;
    iVar21 = local_b1c;
    uVar29 = (uint)local_828;
    if (!tVar20) {
LAB_00383f81:
      if (this->relax_count < 2) {
        SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::relax(&this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
        this->relax_count = this->relax_count + 1;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 0xc) =
             local_9c8.m_backend.data._M_elems._48_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 0xe) =
             local_9c8.m_backend.data._M_elems._56_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 8) =
             local_9c8.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 10) =
             local_9c8.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 4) =
             local_9c8.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 6) =
             local_9c8.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(local_b28->m_backend).data._M_elems =
             local_9c8.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_b28->m_backend).data._M_elems + 2) =
             local_9c8.m_backend.data._M_elems._8_8_;
        (local_b28->m_backend).exp = local_9c8.m_backend.exp;
        (local_b28->m_backend).neg = local_9c8.m_backend.neg;
        (local_b28->m_backend).fpclass = local_9c8.m_backend.fpclass;
        (local_b28->m_backend).prec_elem = local_9c8.m_backend.prec_elem;
        enterId = selectEnter(this,local_b28,iVar21,false);
      }
      return (SPxId)enterId.super_DataKey;
    }
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar38 = pBVar7[local_b38].src == PVEC;
    if (bVar38) {
      local_178.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
      local_178.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
      pnVar27 = &local_178;
      local_178.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
      local_178.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
      local_178.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
      local_178.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
      local_178.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
      local_178.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
      local_178.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
      local_178.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
      local_178.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
      local_178.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
      local_178.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
      local_178.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
      local_178.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
      local_178.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
      local_178.m_backend.exp = stab.m_backend.exp;
      local_178.m_backend.neg = stab.m_backend.neg;
      local_178.m_backend.fpclass = stab.m_backend.fpclass;
      local_178.m_backend.prec_elem = stab.m_backend.prec_elem;
      pnVar32 = &local_1c8;
      lowstab.m_backend.data._M_elems[0] = (uint)uVar23;
      lowstab.m_backend.data._M_elems[1] = SUB84(uVar23,4);
      local_1c8.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
      local_1c8.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
      lowstab.m_backend.data._M_elems[2] = (uint)uVar25;
      lowstab.m_backend.data._M_elems[3] = SUB84(uVar25,4);
      local_1c8.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
      local_1c8.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
      lowstab.m_backend.data._M_elems[4] = (uint)uVar24;
      lowstab.m_backend.data._M_elems[5] = SUB84(uVar24,4);
      local_1c8.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      local_1c8.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
      lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
      local_1c8.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
      local_1c8.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
      lowstab.m_backend.data._M_elems[8] = (uint)uVar14;
      lowstab.m_backend.data._M_elems[9] = SUB84(uVar14,4);
      local_1c8.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
      local_1c8.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
      lowstab.m_backend.data._M_elems[10] = (uint)uVar16;
      lowstab.m_backend.data._M_elems[0xb] = SUB84(uVar16,4);
      local_1c8.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
      local_1c8.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
      lowstab.m_backend.data._M_elems[0xc] = (uint)uVar18;
      lowstab.m_backend.data._M_elems[0xd] = SUB84(uVar18,4);
      local_1c8.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
      local_1c8.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
      local_1c8.m_backend.exp = local_b18;
      local_1c8.m_backend.neg = (bool)local_b10._0_1_;
      local_1c8.m_backend.fpclass = local_b34;
      local_1c8.m_backend.prec_elem = (int)local_b30;
      pnVar41 = &local_218;
      local_218.m_backend.data._M_elems[0] = local_9c8.m_backend.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = local_9c8.m_backend.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = local_9c8.m_backend.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = local_9c8.m_backend.data._M_elems[3];
      local_218.m_backend.data._M_elems[4] = local_9c8.m_backend.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = local_9c8.m_backend.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = local_9c8.m_backend.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = local_9c8.m_backend.data._M_elems[7];
      local_218.m_backend.data._M_elems[8] = local_9c8.m_backend.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = local_9c8.m_backend.data._M_elems[9];
      local_218.m_backend.data._M_elems[10] = local_9c8.m_backend.data._M_elems[10];
      local_218.m_backend.data._M_elems[0xb] = local_9c8.m_backend.data._M_elems[0xb];
      local_218.m_backend.data._M_elems[0xc] = local_9c8.m_backend.data._M_elems[0xc];
      local_218.m_backend.data._M_elems[0xd] = local_9c8.m_backend.data._M_elems[0xd];
      local_218.m_backend.data._M_elems[0xe] = local_9c8.m_backend.data._M_elems[0xe];
      local_218.m_backend.data._M_elems[0xf] = local_9c8.m_backend.data._M_elems[0xf];
      local_218.m_backend.exp = local_9c8.m_backend.exp;
      local_218.m_backend.neg = local_9c8.m_backend.neg;
      local_218.m_backend.fpclass = local_9c8.m_backend.fpclass;
      local_218.m_backend.prec_elem = local_9c8.m_backend.prec_elem;
      upp_00 = local_920;
      local_1c8.m_backend.data._M_elems._56_8_ = uVar9;
    }
    else {
      local_268.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
      local_268.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
      pnVar27 = &local_268;
      local_268.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
      local_268.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
      local_268.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
      local_268.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
      local_268.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
      local_268.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
      local_268.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
      local_268.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
      local_268.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
      local_268.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
      local_268.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
      local_268.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
      local_268.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
      local_268.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
      local_268.m_backend.exp = stab.m_backend.exp;
      local_268.m_backend.neg = stab.m_backend.neg;
      local_268.m_backend.fpclass = stab.m_backend.fpclass;
      local_268.m_backend.prec_elem = stab.m_backend.prec_elem;
      pnVar32 = &local_2b8;
      lowstab.m_backend.data._M_elems[0] = (uint)uVar23;
      lowstab.m_backend.data._M_elems[1] = SUB84(uVar23,4);
      local_2b8.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
      local_2b8.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
      lowstab.m_backend.data._M_elems[2] = (uint)uVar25;
      lowstab.m_backend.data._M_elems[3] = SUB84(uVar25,4);
      local_2b8.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
      local_2b8.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
      lowstab.m_backend.data._M_elems[4] = (uint)uVar24;
      lowstab.m_backend.data._M_elems[5] = SUB84(uVar24,4);
      local_2b8.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      local_2b8.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
      lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
      local_2b8.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
      local_2b8.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
      lowstab.m_backend.data._M_elems[8] = (uint)uVar14;
      lowstab.m_backend.data._M_elems[9] = SUB84(uVar14,4);
      local_2b8.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
      local_2b8.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
      lowstab.m_backend.data._M_elems[10] = (uint)uVar16;
      lowstab.m_backend.data._M_elems[0xb] = SUB84(uVar16,4);
      local_2b8.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
      local_2b8.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
      lowstab.m_backend.data._M_elems[0xc] = (uint)uVar18;
      lowstab.m_backend.data._M_elems[0xd] = SUB84(uVar18,4);
      local_2b8.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
      local_2b8.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
      local_2b8.m_backend.exp = local_b18;
      local_2b8.m_backend.neg = (bool)local_b10._0_1_;
      local_2b8.m_backend.fpclass = local_b34;
      local_2b8.m_backend.prec_elem = (int)local_b30;
      pnVar41 = &local_308;
      local_308.m_backend.data._M_elems[0] = local_9c8.m_backend.data._M_elems[0];
      local_308.m_backend.data._M_elems[1] = local_9c8.m_backend.data._M_elems[1];
      local_308.m_backend.data._M_elems[2] = local_9c8.m_backend.data._M_elems[2];
      local_308.m_backend.data._M_elems[3] = local_9c8.m_backend.data._M_elems[3];
      local_308.m_backend.data._M_elems[4] = local_9c8.m_backend.data._M_elems[4];
      local_308.m_backend.data._M_elems[5] = local_9c8.m_backend.data._M_elems[5];
      local_308.m_backend.data._M_elems[6] = local_9c8.m_backend.data._M_elems[6];
      local_308.m_backend.data._M_elems[7] = local_9c8.m_backend.data._M_elems[7];
      local_308.m_backend.data._M_elems[8] = local_9c8.m_backend.data._M_elems[8];
      local_308.m_backend.data._M_elems[9] = local_9c8.m_backend.data._M_elems[9];
      local_308.m_backend.data._M_elems[10] = local_9c8.m_backend.data._M_elems[10];
      local_308.m_backend.data._M_elems[0xb] = local_9c8.m_backend.data._M_elems[0xb];
      local_308.m_backend.data._M_elems[0xc] = local_9c8.m_backend.data._M_elems[0xc];
      local_308.m_backend.data._M_elems[0xd] = local_9c8.m_backend.data._M_elems[0xd];
      local_308.m_backend.data._M_elems[0xe] = local_9c8.m_backend.data._M_elems[0xe];
      local_308.m_backend.data._M_elems[0xf] = local_9c8.m_backend.data._M_elems[0xf];
      local_308.m_backend.exp = local_9c8.m_backend.exp;
      local_308.m_backend.neg = local_9c8.m_backend.neg;
      local_308.m_backend.fpclass = local_9c8.m_backend.fpclass;
      local_308.m_backend.prec_elem = local_9c8.m_backend.prec_elem;
      upd_01 = upd;
      vec_01 = vec;
      low_01 = low;
      local_2b8.m_backend.data._M_elems._56_8_ = uVar9;
    }
    lowstab.m_backend.data._M_elems._0_8_ = uVar10;
    lowstab.m_backend.data._M_elems._8_8_ = uVar11;
    lowstab.m_backend.data._M_elems._16_8_ = uVar12;
    lowstab.m_backend.data._M_elems._24_8_ = uVar13;
    lowstab.m_backend.data._M_elems._32_8_ = uVar15;
    lowstab.m_backend.data._M_elems._40_8_ = uVar17;
    lowstab.m_backend.data._M_elems._48_8_ = uVar19;
    bVar38 = getData(this,local_b28,&enterId,pBVar7[local_b38].idx,pnVar27,pnVar32,upd_01,vec_01,
                     low_01,upp_00,(uint)!bVar38,pnVar41);
    if (!bVar38) goto LAB_00383f81;
  }
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  if (0 < (int)uVar29) {
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_358 = *(undefined8 *)&pBVar7[uVar29].val.m_backend;
    uStack_350 = *(undefined8 *)((long)&pBVar7[uVar29].val.m_backend + 8);
    puVar1 = (uint *)((long)&pBVar7[uVar29].val.m_backend + 0x10);
    local_348 = *(undefined8 *)puVar1;
    uStack_340 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pBVar7[uVar29].val.m_backend + 0x20);
    local_338 = *(undefined8 *)puVar1;
    uStack_330 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pBVar7[uVar29].val.m_backend + 0x30);
    local_328 = *(undefined8 *)puVar1;
    uStack_320 = *(undefined8 *)(puVar1 + 2);
    local_318 = *(int *)((long)&pBVar7[uVar29].val.m_backend + 0x40);
    local_314 = *(bool *)((long)&pBVar7[uVar29].val.m_backend + 0x44);
    local_310 = *(undefined8 *)((long)&pBVar7[uVar29].val.m_backend + 0x48);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result,(multiprecision *)&local_358,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)CONCAT31((int3)((uint)local_318 >> 8),local_314));
    tVar20 = boost::multiprecision::operator>(&result,local_830);
    pcVar36 = local_928;
    if (tVar20) {
      flipAndUpdate(this,(int *)&local_afc);
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->boundflips = local_afc;
      if (9 < (int)local_afc) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(pcVar36,1);
        uVar25._0_4_ = enterId.super_DataKey.info;
        uVar25._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar25;
      }
      result.m_backend.data._M_elems[0] = 0x9999999a;
      result.m_backend.data._M_elems[1] = 0x3fa99999;
      goto LAB_0038401e;
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  result.m_backend.data._M_elems[0] = 0x9999999a;
  result.m_backend.data._M_elems[1] = 0x3fb99999;
  pcVar36 = local_928;
LAB_0038401e:
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (pcVar36,(double *)&result);
  uVar24._0_4_ = enterId.super_DataKey.info;
  uVar24._4_4_ = enterId.super_DataKey.idx;
  return (SPxId)uVar24;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}